

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

void RegisterRawTransactionRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffde8;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterRawTransactionRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterRawTransactionRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdff);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdfe);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 1,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdfd);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 2,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdfc);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 3,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdfb);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 4,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_e0,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdfa);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 5,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf9);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 6,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>
                (local_120,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf8);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 7,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_120);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf7);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 8,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_140);
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf6);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 9,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_160);
      std::__cxx11::string::string<std::allocator<char>>
                (local_180,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf5);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 10,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_180);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a0,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf4);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 0xb,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c0,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf3);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 0xc,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_1c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e0,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffdf2);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 0xd,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)local_1e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe00,"rawtransactions",
                 (allocator<char> *)&stack0xfffffffffffffdf1);
      CRPCCommand::CRPCCommand
                (RegisterRawTransactionRPCCommands::commands + 0xe,in_stack_fffffffffffffde8,
                 (RpcMethodFnType)&stack0xfffffffffffffe00);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterRawTransactionRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterRawTransactionRPCCommands::commands;
  for (lVar2 = 0x780; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterRawTransactionRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"rawtransactions", &getrawtransaction},
        {"rawtransactions", &createrawtransaction},
        {"rawtransactions", &decoderawtransaction},
        {"rawtransactions", &decodescript},
        {"rawtransactions", &combinerawtransaction},
        {"rawtransactions", &signrawtransactionwithkey},
        {"rawtransactions", &decodepsbt},
        {"rawtransactions", &combinepsbt},
        {"rawtransactions", &finalizepsbt},
        {"rawtransactions", &createpsbt},
        {"rawtransactions", &converttopsbt},
        {"rawtransactions", &utxoupdatepsbt},
        {"rawtransactions", &descriptorprocesspsbt},
        {"rawtransactions", &joinpsbts},
        {"rawtransactions", &analyzepsbt},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}